

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

char * __thiscall
CVmObjBigNum::explicit_to_string
          (CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *new_str,int radix,int flags)

{
  int iVar1;
  char *pcVar2;
  vm_obj_id_t vVar3;
  
  vVar3 = self;
  if (radix == 10) {
    if ((flags & 2U) != 0) {
LAB_0025e4b0:
      pcVar2 = cvt_to_string_in_radix(this,vVar3,new_str,radix);
      return pcVar2;
    }
  }
  else {
    iVar1 = is_frac_zero((this->super_CVmObject).ext_);
    if ((flags & 2U) != 0 || iVar1 != 0) goto LAB_0025e4b0;
  }
  pcVar2 = cvt_to_string(self,new_str,(this->super_CVmObject).ext_,100,-1,-1,-1,0,(vm_val_t *)0x0);
  return pcVar2;
}

Assistant:

const char *CVmObjBigNum::explicit_to_string(
    VMG_ vm_obj_id_t self, vm_val_t *new_str, int radix, int flags) const
{
    /*
     *   If they want a non-decimal conversion, and we're a whole integer
     *   without a fractional part, generate the integer representation in
     *   the given radix.  If we have a fractional part, or the requested
     *   radix is decimal, use the floating-point formatter instead.
     *   
     *   Also use an integer conversion if we've been specfically asked for
     *   an integer conversion.  
     */
    if ((radix != 10 && is_frac_zero(ext_))
        || (flags & TOSTR_ROUND) != 0)
    {
        /* 
         *   it's all integer, and we have a non-decimal radix - format as an
         *   integer 
         */
        return cvt_to_string_in_radix(vmg_ self, new_str, radix);
    }
    else
    {   
        /* 
         *   no radix, or we have a fraction - use the basic floating-point
         *   formatter with default options 
         */
        return cvt_to_string(vmg_ self, new_str, ext_, 100, -1, -1, -1, 0, 0);
    }
}